

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall
Centaurus::CharClass<unsigned_char>::CharClass
          (CharClass<unsigned_char> *this,wchar_t start,wchar_t end)

{
  Range<unsigned_char> local_28;
  wchar_t local_18;
  wchar_t local_14;
  wchar_t end_local;
  wchar_t start_local;
  CharClass<unsigned_char> *this_local;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_00289fe8;
  local_18 = end;
  local_14 = start;
  _end_local = this;
  std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
  vector(&this->m_ranges);
  Range<unsigned_char>::make_from_wide(&local_28,local_14,local_18);
  std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
  push_back(&this->m_ranges,&local_28);
  Range<unsigned_char>::~Range(&local_28);
  return;
}

Assistant:

CharClass(wchar_t start, wchar_t end)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(start, end));
    }